

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void connect_to_server(h2o_memcached_context_t *ctx,yrmcds *yrmcds)

{
  ushort uVar1;
  char *pcVar2;
  FILE *__stream;
  yrmcds_error e;
  int iVar3;
  char *pcVar4;
  long lStack_20;
  yrmcds_error err;
  size_t failcnt;
  yrmcds *yrmcds_local;
  h2o_memcached_context_t *ctx_local;
  
  lStack_20 = 0;
  while( true ) {
    e = yrmcds_connect(yrmcds,ctx->host,ctx->port);
    __stream = _stderr;
    if (e == YRMCDS_OK) break;
    if (lStack_20 == 0) {
      pcVar2 = ctx->host;
      uVar1 = ctx->port;
      pcVar4 = yrmcds_strerror(e);
      fprintf(__stream,"[lib/common/memcached.c] failed to connect to memcached at %s:%u, %s\n",
              pcVar2,(ulong)uVar1,pcVar4);
    }
    iVar3 = rand();
    usleep(iVar3 % 3000000 + 2000000);
    lStack_20 = lStack_20 + 2;
  }
  if (ctx->text_protocol != 0) {
    yrmcds_text_mode(yrmcds);
  }
  fprintf(_stderr,"[lib/common/memcached.c] connected to memcached at %s:%u\n",ctx->host,
          (ulong)ctx->port);
  return;
}

Assistant:

static yrmcds_error connect_to_server(const char* node, uint16_t port, int* server_fd) {
    if( node == NULL )
        return YRMCDS_BAD_ARGUMENT;

    long fl;
    char sport[8];
    snprintf(sport, sizeof(sport), "%u", (unsigned int)port);

    struct addrinfo hint, *res;
    memset(&hint, 0, sizeof(hint));
    hint.ai_family = AF_INET;  // prefer IPv4
    hint.ai_socktype = SOCK_STREAM;
    hint.ai_flags = AI_NUMERICSERV|AI_ADDRCONFIG;
    int e = getaddrinfo(node, sport, &hint, &res);
    if( e == EAI_FAMILY || e == EAI_NONAME
#ifdef EAI_ADDRFAMILY
        || e == EAI_ADDRFAMILY
#endif
#ifdef EAI_NODATA
        || e == EAI_NODATA
#endif
        ) {
        hint.ai_family = AF_INET6;
        // intentionally drop AI_ADDRCONFIG to support IPv6 link-local address.
        // see https://github.com/cybozu/yrmcds/issues/40
        hint.ai_flags = AI_NUMERICSERV|AI_V4MAPPED;
        e = getaddrinfo(node, sport, &hint, &res);
    }
    if( e == EAI_SYSTEM ) {
        return YRMCDS_SYSTEM_ERROR;
    } else if( e != 0 ) {
        return YRMCDS_NOT_RESOLVED;
    }

    int s = socket(res->ai_family,
                   res->ai_socktype
#ifdef __linux__
                   | SOCK_NONBLOCK | SOCK_CLOEXEC
#endif
                   , res->ai_protocol);
    if( s == -1 ) {
        e = errno;
        freeaddrinfo(res);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
#ifndef __linux__
    fl = fcntl(s, F_GETFD, 0);
    fcntl(s, F_SETFD, fl | FD_CLOEXEC);
    fl = fcntl(s, F_GETFL, 0);
    fcntl(s, F_SETFL, fl | O_NONBLOCK);
#endif
    e = connect(s, res->ai_addr, res->ai_addrlen);
    freeaddrinfo(res);
    if( e == -1 && errno != EINPROGRESS ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }

    if( e != 0 ) {
        struct pollfd fds;
        fds.fd = s;
        fds.events = POLLOUT;
        int n = poll(&fds, 1, 5000);
        if( n == 0 ) { // timeout
            close(s);
            return YRMCDS_TIMEOUT;
        }
        if( n == -1 ) {
            e = errno;
            close(s);
            errno = e;
            return YRMCDS_SYSTEM_ERROR;
        }

        if( fds.revents & (POLLERR|POLLHUP|POLLNVAL) ) {
            close(s);
            return YRMCDS_DISCONNECTED;
        }
        socklen_t l = sizeof(e);
        if( getsockopt(s, SOL_SOCKET, SO_ERROR, &e, &l) == -1 ) {
            close(s);
            return YRMCDS_SYSTEM_ERROR;
        }
        if( e != 0 ) {
            close(s);
            errno = e;
            return YRMCDS_SYSTEM_ERROR;
        }
    }
    fl = fcntl(s, F_GETFL, 0);
    if( fcntl(s, F_SETFL, fl & ~O_NONBLOCK) == -1 ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
    int ok = 1;
    if( setsockopt(s, IPPROTO_TCP, TCP_NODELAY, &ok, sizeof(ok)) == -1 ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
    *server_fd = s;
    return YRMCDS_OK;
}